

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<int>::Add
          (DictionaryTypeHandlerBase<int> *this,PropertyRecord *propertyRecord,
          PropertyAttributes attributes,bool isInitialized,bool isFixed,bool usedAsFixed,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  PropertyId propertyId;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar7;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_01;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_02;
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  DictionaryPropertyDescriptor<int> descriptor;
  int index;
  bool usedAsFixed_local;
  bool isFixed_local;
  bool isInitialized_local;
  PropertyAttributes attributes_local;
  PropertyRecord *propertyRecord_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  descriptor.Setter._0_1_ = usedAsFixed;
  descriptor.Setter._1_1_ = isFixed;
  descriptor.Setter._2_1_ = isInitialized;
  descriptor.Setter._3_1_ = attributes;
  _index = (RuntimeFunction *)propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  iVar3 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
  if (0x3fffffff < iVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x17e,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  iVar3 = this->nextPropertyIndex;
  iVar4 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
  if (iVar4 <= iVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x17f,"(nextPropertyIndex < this->GetSlotCapacity())",
                                "nextPropertyIndex < this->GetSlotCapacity()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  descriptor.Getter = ::Math::PostInc<int>(&this->nextPropertyIndex);
  DictionaryPropertyDescriptor<int>::DictionaryPropertyDescriptor
            ((DictionaryPropertyDescriptor<int> *)local_30,descriptor.Getter,descriptor.Setter._3_1_
             ,false,false,false);
  if (((descriptor.Setter._1_1_ & 1) != 0) || (((byte)descriptor.Setter & 1) != 0)) {
    propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)_index);
    BVar5 = IsInternalPropertyId(propertyId);
    if (BVar5 == 0) {
      ppRVar7 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                          ((WriteBarrierPtr *)&this->singletonInstance);
      if (*ppRVar7 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) goto LAB_013fa569;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x184,
                                "((!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr))"
                                ,
                                "(!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
LAB_013fa569:
  DictionaryPropertyDescriptor<int>::SetIsInitialized
            ((DictionaryPropertyDescriptor<int> *)local_30,(bool)(descriptor.Setter._2_1_ & 1));
  DictionaryPropertyDescriptor<int>::SetIsFixed
            ((DictionaryPropertyDescriptor<int> *)local_30,(bool)(descriptor.Setter._1_1_ & 1));
  DictionaryPropertyDescriptor<int>::SetUsedAsFixed
            ((DictionaryPropertyDescriptor<int> *)local_30,(bool)((byte)descriptor.Setter & 1));
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  JsUtil::
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Add(this_00,(PropertyRecord **)&index,(DictionaryPropertyDescriptor<int> *)local_30);
  ScriptContext::GetLibrary(scriptContext);
  JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
            ((JavascriptLibrary *)(local_40 + 8));
  this_01 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
            operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                       (local_40 + 8));
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
            (this_01,&this->super_DynamicTypeHandler,descriptor.Setter._3_1_,
             (PropertyRecord *)_index,scriptContext);
  ScriptContext::GetLibrary(scriptContext);
  JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache((JavascriptLibrary *)local_40);
  this_02 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
            operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                       local_40);
  PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
            (this_02,&this->super_DynamicTypeHandler,descriptor.Setter._3_1_,
             (PropertyRecord *)_index,scriptContext);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::Add(
        const PropertyRecord* propertyRecord,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);   // slotCapacity should never exceed MaxPropertyIndexSize
        Assert(nextPropertyIndex < this->GetSlotCapacity());       // nextPropertyIndex must be ready
        T index = ::Math::PostInc(nextPropertyIndex);

        DictionaryPropertyDescriptor<T> descriptor(index, attributes);
#if ENABLE_FIXED_FIELDS
        Assert((!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr));
        descriptor.SetIsInitialized(isInitialized);
        descriptor.SetIsFixed(isFixed);
        descriptor.SetUsedAsFixed(usedAsFixed);
#endif
        propertyMap->Add(propertyRecord, descriptor);

        scriptContext->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyRecord, scriptContext);
        scriptContext->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyRecord, scriptContext);
    }